

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O3

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,320ul,16ul>>
::
nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>
          (locator *__return_storage_ptr__,void *this,arrays_type *arrays_,size_t pos0,size_t hash,
          try_emplace_args_t *args,basic_string_view<char,_std::char_traits<char>_> *args_1,
          ArgTokens *args_2)

{
  char *pcVar1;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens> *ppVar2;
  byte *pbVar3;
  byte bVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  ushort uVar8;
  size_t sVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  lVar5 = *(long *)((long)this + 0x10);
  lVar10 = (long)arrays_ * 0x10;
  pcVar1 = (char *)(lVar5 + lVar10);
  auVar13[0] = -(*pcVar1 == '\0');
  auVar13[1] = -(pcVar1[1] == '\0');
  auVar13[2] = -(pcVar1[2] == '\0');
  auVar13[3] = -(pcVar1[3] == '\0');
  auVar13[4] = -(pcVar1[4] == '\0');
  auVar13[5] = -(pcVar1[5] == '\0');
  auVar13[6] = -(pcVar1[6] == '\0');
  auVar13[7] = -(pcVar1[7] == '\0');
  auVar13[8] = -(pcVar1[8] == '\0');
  auVar13[9] = -(pcVar1[9] == '\0');
  auVar13[10] = -(pcVar1[10] == '\0');
  auVar13[0xb] = -(pcVar1[0xb] == '\0');
  auVar13[0xc] = -(pcVar1[0xc] == '\0');
  auVar13[0xd] = -(pcVar1[0xd] == '\0');
  auVar13[0xe] = -(pcVar1[0xe] == '\0');
  auVar13[0xf] = -(pcVar1[0xf] == '\0');
  uVar11 = (uint)(ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe);
  if (uVar11 == 0) {
    uVar6 = *(ulong *)((long)this + 8);
    lVar12 = 1;
    do {
      pbVar3 = (byte *)(lVar5 + 0xf + (long)arrays_ * 0x10);
      *pbVar3 = *pbVar3 | '\x01' << ((byte)pos0 & 7);
      arrays_ = (arrays_type *)((long)&arrays_->groups_size_index + lVar12 & uVar6);
      lVar10 = (long)arrays_ * 0x10;
      pcVar1 = (char *)(lVar5 + lVar10);
      auVar14[0] = -(*pcVar1 == '\0');
      auVar14[1] = -(pcVar1[1] == '\0');
      auVar14[2] = -(pcVar1[2] == '\0');
      auVar14[3] = -(pcVar1[3] == '\0');
      auVar14[4] = -(pcVar1[4] == '\0');
      auVar14[5] = -(pcVar1[5] == '\0');
      auVar14[6] = -(pcVar1[6] == '\0');
      auVar14[7] = -(pcVar1[7] == '\0');
      auVar14[8] = -(pcVar1[8] == '\0');
      auVar14[9] = -(pcVar1[9] == '\0');
      auVar14[10] = -(pcVar1[10] == '\0');
      auVar14[0xb] = -(pcVar1[0xb] == '\0');
      auVar14[0xc] = -(pcVar1[0xc] == '\0');
      auVar14[0xd] = -(pcVar1[0xd] == '\0');
      auVar14[0xe] = -(pcVar1[0xe] == '\0');
      auVar14[0xf] = -(pcVar1[0xf] == '\0');
      uVar8 = (ushort)(SUB161(auVar14 >> 7,0) & 1) | (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe;
      uVar11 = (uint)uVar8;
      lVar12 = lVar12 + 1;
    } while (uVar8 == 0);
  }
  uVar7 = 0;
  if (uVar11 != 0) {
    for (; (uVar11 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
    }
  }
  ppVar2 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens> *)
           ((long)arrays_ * 600 + *(long *)((long)this + 0x18) + (ulong)uVar7 * 0x28);
  pcVar1 = *(char **)(hash + 8);
  (ppVar2->first)._M_len = *(size_t *)hash;
  (ppVar2->first)._M_str = pcVar1;
  sVar9 = *(size_t *)(args + 8);
  (ppVar2->second).super_span<const_slang::parsing::Token,_18446744073709551615UL>._M_ptr =
       *(pointer *)args;
  (ppVar2->second).super_span<const_slang::parsing::Token,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar9;
  *(undefined8 *)&(ppVar2->second).isExpanded = *(undefined8 *)(args + 0x10);
  bVar4 = *(byte *)(&group15<boost::unordered::detail::foa::plain_integral>::
                     match_word(unsigned_long)::word + (pos0 & 0xff));
  ((group15<boost::unordered::detail::foa::plain_integral> *)(lVar5 + lVar10))->m[uVar7].n = bVar4;
  __return_storage_ptr__->pg =
       (group15<boost::unordered::detail::foa::plain_integral> *)(lVar5 + lVar10);
  __return_storage_ptr__->n = uVar7;
  __return_storage_ptr__->p = ppVar2;
  return (locator *)(ulong)bVar4;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }